

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereIndexedExprCleanup(sqlite3 *db,void *pObject)

{
  undefined8 *p_00;
  IndexedExpr *p;
  Parse *pParse;
  void *pObject_local;
  sqlite3 *db_local;
  
  while (*(long *)((long)pObject + 0x60) != 0) {
    p_00 = *(undefined8 **)((long)pObject + 0x60);
    *(undefined8 *)((long)pObject + 0x60) = p_00[3];
    sqlite3ExprDelete(db,(Expr *)*p_00);
    sqlite3DbFreeNN(db,p_00);
  }
  return;
}

Assistant:

static void whereIndexedExprCleanup(sqlite3 *db, void *pObject){
  Parse *pParse = (Parse*)pObject;
  while( pParse->pIdxExpr!=0 ){
    IndexedExpr *p = pParse->pIdxExpr;
    pParse->pIdxExpr = p->pIENext;
    sqlite3ExprDelete(db, p->pExpr);
    sqlite3DbFreeNN(db, p);
  }
}